

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t archive_read_format_lha_bid(archive_read *a,wchar_t best_bid)

{
  size_t sVar1;
  size_t next;
  ssize_t window;
  ssize_t offset;
  ssize_t bytes_avail;
  void *buff;
  char *p;
  archive_read *paStack_18;
  wchar_t best_bid_local;
  archive_read *a_local;
  
  if (best_bid < L'\x1f') {
    p._4_4_ = best_bid;
    paStack_18 = a;
    buff = __archive_read_ahead(a,0x16,(ssize_t *)0x0);
    if (buff == (void *)0x0) {
      a_local._4_4_ = L'\xffffffff';
    }
    else {
      sVar1 = lha_check_header_format(buff);
      if (sVar1 == 0) {
        a_local._4_4_ = L'\x1e';
      }
      else if ((*buff == 'M') && (*(char *)((long)buff + 1) == 'Z')) {
        window = 0;
        next = 0x1000;
        do {
          while( true ) {
            if (0x4fff < window) goto LAB_0084e201;
            bytes_avail = (ssize_t)__archive_read_ahead(paStack_18,window + next,&offset);
            if ((void *)bytes_avail == (void *)0x0) break;
            for (buff = (void *)(bytes_avail + window);
                (long)buff + 0x16U < (ulong)(bytes_avail + offset);
                buff = (void *)(sVar1 + (long)buff)) {
              sVar1 = lha_check_header_format(buff);
              if (sVar1 == 0) {
                return L'\x1e';
              }
            }
            window = (long)buff - bytes_avail;
          }
          next = (long)next >> 1;
        } while (0x18 < next);
        a_local._4_4_ = L'\0';
      }
      else {
LAB_0084e201:
        a_local._4_4_ = L'\0';
      }
    }
  }
  else {
    a_local._4_4_ = L'\xffffffff';
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_lha_bid(struct archive_read *a, int best_bid)
{
	const char *p;
	const void *buff;
	ssize_t bytes_avail, offset, window;
	size_t next;

	/* If there's already a better bid than we can ever
	   make, don't bother testing. */
	if (best_bid > 30)
		return (-1);

	if ((p = __archive_read_ahead(a, H_SIZE, NULL)) == NULL)
		return (-1);

	if (lha_check_header_format(p) == 0)
		return (30);

	if (p[0] == 'M' && p[1] == 'Z') {
		/* PE file */
		offset = 0;
		window = 4096;
		while (offset < (1024 * 20)) {
			buff = __archive_read_ahead(a, offset + window,
			    &bytes_avail);
			if (buff == NULL) {
				/* Remaining bytes are less than window. */
				window >>= 1;
				if (window < (H_SIZE + 3))
					return (0);
				continue;
			}
			p = (const char *)buff + offset;
			while (p + H_SIZE < (const char *)buff + bytes_avail) {
				if ((next = lha_check_header_format(p)) == 0)
					return (30);
				p += next;
			}
			offset = p - (const char *)buff;
		}
	}
	return (0);
}